

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnDonate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *donor,PlayerInfo *player,
          double amount)

{
  bool bVar1;
  __sv_type _Var2;
  code *local_e0;
  size_t local_c0;
  char *local_b8;
  string local_b0;
  __sv_type local_90;
  __sv_type local_80;
  undefined1 local_60 [8];
  string msg;
  logFuncType func;
  double amount_local;
  PlayerInfo *player_local;
  PlayerInfo *donor_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x35 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_60,&this->donateFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if (!bVar1) {
    RenX::processTags((string *)local_60,server,donor,player,(BuildingInfo *)0x0);
    local_80 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(RenX::tags + 0x14e8));
    string_printf_abi_cxx11_(&local_b0,"%.0f",amount);
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
    RenX::replace_tag(local_60,local_80._M_len,local_80._M_str,local_90._M_len,local_90._M_str);
    std::__cxx11::string::~string((string *)&local_b0);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_e0 = (code *)msg.field_2._8_8_;
    }
    else {
      local_e0 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_c0 = _Var2._M_len;
    local_b8 = _Var2._M_str;
    (*local_e0)(server,local_c0,local_b8);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDonate(RenX::Server &server, const RenX::PlayerInfo &donor, const RenX::PlayerInfo &player, double amount)
{
	logFuncType func;
	if (RenX_LoggingPlugin::donatePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->donateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &donor, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, string_printf("%.0f", amount));
		(server.*func)(msg);
	}
}